

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O0

void sfts_find_hdukey(sfts_t *f,char *key)

{
  int iVar1;
  char *pcVar2;
  long in_RDI;
  char *_base;
  char _msg [31];
  char *val;
  int i;
  int num;
  char *in_stack_ffffffffffffffb8;
  sfts_t *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffdc;
  sfts_t *in_stack_ffffffffffffffe0;
  int local_18;
  
  iVar1 = sfts_get_nhdus(in_stack_ffffffffffffffe0);
  local_18 = 1;
  do {
    if (iVar1 < local_18) {
LAB_0010a415:
      if ((in_RDI != 0) && (*(int *)(in_RDI + 0x20) != 0)) {
        if (*(long *)(in_RDI + 0x10) == 0) {
          pcVar2 = (char *)g_strdup("memory");
        }
        else {
          pcVar2 = (char *)g_path_get_basename(*(undefined8 *)(in_RDI + 0x10));
        }
        ffgerr((int)((ulong)pcVar2 >> 0x20),pcVar2);
        _p2sc_msg("sfts_find_hdukey",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
                  ,0x230,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x11f8,"FITS: %s: %s"
                  ,&stack0xffffffffffffffb8,pcVar2);
        exit(1);
      }
      return;
    }
    sfts_goto_hdu(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    pcVar2 = sfts_read_keystring0(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (pcVar2 != (char *)0x0) {
      g_free(pcVar2);
      goto LAB_0010a415;
    }
    local_18 = local_18 + 1;
    in_stack_ffffffffffffffe0 = (sfts_t *)0x0;
  } while( true );
}

Assistant:

void sfts_find_hdukey(sfts_t *f, const char *key) {
    int num = sfts_get_nhdus(f);
    for (int i = 1; i <= num; ++i) {
        sfts_goto_hdu(f, i);
        char *val = sfts_read_keystring0(f, key);
        if (val == NULL)
            continue;
        else {
            g_free(val);
            break;
        }
    }
    CHK_FTS(f);
}